

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

string * deqp::gls::BuiltinPrecisionTests::Functions::vecName<float,4>(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  vecNamePrefix<float>();
  std::operator+(&local_50,&local_30,"vec");
  local_74 = 4;
  de::toString<int>(&local_70,&local_74);
  std::operator+(in_RDI,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

string vecName (void) { return vecNamePrefix<T>() + "vec" + de::toString(Size); }